

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O0

void __thiscall
gmlc::containers::StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::
freeAll(StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_> *this)

{
  long in_RDI;
  int ii_1;
  int jj_1;
  int ii;
  int jj;
  allocator<helics::Endpoint> a;
  Endpoint *in_stack_ffffffffffffff68;
  new_allocator<helics::Endpoint> *in_stack_ffffffffffffff70;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  undefined1 local_69 [9];
  undefined8 local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined1 *local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined1 *local_8;
  
  if (*(long *)(in_RDI + 8) != 0) {
    CLI::std::allocator<helics::Endpoint>::allocator((allocator<helics::Endpoint> *)0x27afcb);
    local_70 = *(int *)(in_RDI + 0x18);
    while (local_70 = local_70 + -1, -1 < local_70) {
      (*(code *)**(undefined8 **)
                  (*(long *)(*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x14) * 8) +
                  (long)local_70 * 0x78))();
    }
    if (0 < *(int *)(in_RDI + 0x14)) {
      local_10 = *(undefined8 *)(*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x14) * 8);
      local_8 = local_69;
      local_18 = 0x20;
      __gnu_cxx::new_allocator<helics::Endpoint>::deallocate
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x27b06a);
    }
    local_74 = *(int *)(in_RDI + 0x14);
    while (local_74 = local_74 + -1, -1 < local_74) {
      for (local_78 = 0x1f; -1 < local_78; local_78 = local_78 + -1) {
        (*(code *)**(undefined8 **)
                    (*(long *)(*(long *)(in_RDI + 8) + (long)local_74 * 8) + (long)local_78 * 0x78))
                  ();
      }
      local_28 = *(undefined8 *)(*(long *)(in_RDI + 8) + (long)local_74 * 8);
      local_20 = local_69;
      local_30 = 0x20;
      __gnu_cxx::new_allocator<helics::Endpoint>::deallocate
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x27b101);
    }
    if (*(int *)(in_RDI + 0x14) == 0) {
      local_40 = **(undefined8 **)(in_RDI + 8);
      local_38 = local_69;
      local_48 = 0x20;
      __gnu_cxx::new_allocator<helics::Endpoint>::deallocate
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x27b154);
    }
    for (local_7c = 0; local_7c < *(int *)(in_RDI + 0x20); local_7c = local_7c + 1) {
      local_58 = *(undefined8 *)(*(long *)(in_RDI + 0x28) + (long)local_7c * 8);
      local_50 = local_69;
      local_60 = 0x20;
      __gnu_cxx::new_allocator<helics::Endpoint>::deallocate
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x27b1a8);
    }
    if (*(void **)(in_RDI + 0x28) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x28));
    }
    if (*(void **)(in_RDI + 8) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 8));
    }
  }
  return;
}

Assistant:

void freeAll()
        {
            if (dataptr != nullptr) {
                Allocator a;
                for (int jj = bsize - 1; jj >= 0;
                     --jj) {  // call destructors on the last block
                    dataptr[dataSlotIndex][jj].~X();
                }
                if (dataSlotIndex > 0) {
                    a.deallocate(dataptr[dataSlotIndex], blockSize);
                }
                // go in reverse order
                for (int ii = dataSlotIndex - 1; ii >= 0; --ii) {
                    for (int jj = blockSize - 1; jj >= 0;
                         --jj) {  // call destructors on the middle blocks
                        dataptr[ii][jj].~X();
                    }
                    a.deallocate(dataptr[ii], blockSize);
                }
                if (dataSlotIndex == 0) {
                    a.deallocate(dataptr[0], blockSize);
                }

                for (int ii = 0; ii < freeIndex; ++ii) {
                    a.deallocate(freeblocks[ii], blockSize);
                }
                // delete can handle a nullptr
                delete[] freeblocks;
                delete[] dataptr;
            }
        }